

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall NLReaderTest_ReadVarArgExpr_Test::TestBody(NLReaderTest_ReadVarArgExpr_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  undefined1 uVar3;
  ReadError *e;
  bool in_stack_00000107;
  bool gtest_caught_expected;
  string *in_stack_00000108;
  string gtest_expected_message;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  char *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd6c;
  char *in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd78;
  Type in_stack_fffffffffffffd7c;
  AssertionResult *in_stack_fffffffffffffd80;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Message *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 local_1f1 [33];
  string local_1d0 [38];
  byte local_1aa;
  undefined1 local_1a9 [33];
  AssertionResult local_188 [2];
  allocator<char> local_161;
  string local_160 [32];
  string local_140 [39];
  allocator<char> local_119;
  string local_118 [32];
  string local_f8 [32];
  AssertionResult local_d8 [2];
  allocator<char> local_b1;
  string local_b0 [32];
  string local_90 [55];
  allocator<char> local_59;
  string local_58 [32];
  string local_38 [32];
  AssertionResult local_18;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (allocator<char> *)in_stack_fffffffffffffd80);
  std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (allocator<char> *)in_stack_fffffffffffffd80);
  ReadNL(in_stack_00000108,in_stack_00000107);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    in_stack_fffffffffffffdc8 =
         (Message *)testing::AssertionResult::failure_message((AssertionResult *)0x1511dc);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
    testing::Message::~Message((Message *)0x15123f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151297);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (allocator<char> *)in_stack_fffffffffffffd80);
  std::operator+(in_stack_fffffffffffffd58,(char *)in_stack_fffffffffffffd50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,
             (char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
             (allocator<char> *)in_stack_fffffffffffffd80);
  ReadNL(in_stack_00000108,in_stack_00000107);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator(&local_161);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator(&local_119);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_d8);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd80);
    testing::AssertionResult::failure_message((AssertionResult *)0x1514d4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
    testing::Message::~Message((Message *)0x151531);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151589);
  testing::AssertionSuccess();
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_188);
  if (bVar2) {
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this_00,(char *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88),
               (allocator<char> *)in_stack_fffffffffffffd80);
    std::allocator<char>::~allocator((allocator<char> *)local_1a9);
    local_1aa = 0;
    uVar3 = testing::internal::AlwaysTrue();
    if ((bool)uVar3) {
      in_stack_fffffffffffffd80 = (AssertionResult *)local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_00,(char *)CONCAT17(uVar3,in_stack_fffffffffffffd88),
                 (allocator<char> *)in_stack_fffffffffffffd80);
      ReadNL(in_stack_00000108,in_stack_00000107);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string((string *)(local_1f1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1f1);
    }
    bVar2 = (local_1aa & 1) != 0;
    if (!bVar2) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffffd80,
                 (char (*) [101])CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78));
    }
    std::__cxx11::string::~string((string *)(local_1a9 + 1));
    if (bVar2) goto LAB_00151a32;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffffd80);
  testing::AssertionResult::failure_message((AssertionResult *)0x15198f);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c,
             in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd60);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)CONCAT17(uVar1,in_stack_fffffffffffffdd0),in_stack_fffffffffffffdc8);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd50);
  testing::Message::~Message((Message *)0x1519ea);
LAB_00151a32:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x151a3f);
  return;
}

Assistant:

TEST(NLReaderTest, ReadVarArgExpr) {
  EXPECT_READ("c0: v11(v4, 5, v1);", "C0\no11\n3\nv4\nn5\nv1\n");
  EXPECT_READ("c0: v12(v4);", "C0\no12\n1\nv4\n");
  EXPECT_READ_ERROR("C0\no12\n0\n" , "(input):19:1: too few arguments");
}